

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

int __thiscall
cmGlobalGenerator::TryCompile
          (cmGlobalGenerator *this,string *srcdir,string *bindir,string *projectName,string *target,
          bool fast,string *output,cmMakefile *mf)

{
  byte bVar1;
  string *projectName_00;
  string *bindir_00;
  string *psVar2;
  int iVar3;
  cmState *this_00;
  char *pcVar4;
  ulong uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  allocator local_f9;
  string local_f8;
  allocator local_d2;
  allocator local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  string config;
  string newTarget;
  allocator local_59;
  string local_58;
  byte local_31;
  string *psStack_30;
  bool fast_local;
  string *target_local;
  string *projectName_local;
  string *bindir_local;
  string *srcdir_local;
  cmGlobalGenerator *this_local;
  
  local_31 = fast;
  psStack_30 = target;
  target_local = projectName;
  projectName_local = bindir;
  bindir_local = srcdir;
  srcdir_local = (string *)this;
  this_00 = cmake::GetState(this->CMakeInstance);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"CMAKE_NUMBER_OF_MAKEFILES",&local_59);
  pcVar4 = cmState::GetInitializedCacheValue(this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (pcVar4 == (char *)0x0) {
    this->FirstTimeProgress = (1.0 - this->FirstTimeProgress) / 30.0 + this->FirstTimeProgress;
    if (0.95 < this->FirstTimeProgress) {
      this->FirstTimeProgress = 0.95;
    }
    cmake::UpdateProgress(this->CMakeInstance,"Configuring",this->FirstTimeProgress);
  }
  std::__cxx11::string::string((string *)(config.field_2._M_local_buf + 8));
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__cxx11::string::operator+=
              ((string *)(config.field_2._M_local_buf + 8),(string *)psStack_30);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"CMAKE_TRY_COMPILE_CONFIGURATION",&local_d1);
  pcVar4 = cmMakefile::GetSafeDefinition(mf,&local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_b0,pcVar4,&local_d2);
  std::allocator<char>::~allocator((allocator<char> *)&local_d2);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  psVar2 = bindir_local;
  bindir_00 = projectName_local;
  projectName_00 = target_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"",&local_f9);
  bVar1 = local_31;
  iVar3 = this->TryCompileTimeout;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_118);
  iVar3 = Build(this,psVar2,bindir_00,projectName_00,(string *)((long)&config.field_2 + 8),output,
                &local_f8,(string *)local_b0,false,(bool)(bVar1 & 1),false,(double)iVar3,OUTPUT_NONE
                ,&local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)(config.field_2._M_local_buf + 8));
  return iVar3;
}

Assistant:

int cmGlobalGenerator::TryCompile(const std::string& srcdir,
                                  const std::string& bindir,
                                  const std::string& projectName,
                                  const std::string& target, bool fast,
                                  std::string& output, cmMakefile* mf)
{
  // if this is not set, then this is a first time configure
  // and there is a good chance that the try compile stuff will
  // take the bulk of the time, so try and guess some progress
  // by getting closer and closer to 100 without actually getting there.
  if (!this->CMakeInstance->GetState()->GetInitializedCacheValue(
        "CMAKE_NUMBER_OF_MAKEFILES")) {
    // If CMAKE_NUMBER_OF_MAKEFILES is not set
    // we are in the first time progress and we have no
    // idea how long it will be.  So, just move 1/10th of the way
    // there each time, and don't go over 95%
    this->FirstTimeProgress += ((1.0f - this->FirstTimeProgress) / 30.0f);
    if (this->FirstTimeProgress > 0.95f) {
      this->FirstTimeProgress = 0.95f;
    }
    this->CMakeInstance->UpdateProgress("Configuring",
                                        this->FirstTimeProgress);
  }

  std::string newTarget;
  if (!target.empty()) {
    newTarget += target;
#if 0
#if defined(_WIN32) || defined(__CYGWIN__)
    std::string tmp = target;
    // if the target does not already end in . something
    // then assume .exe
    if(tmp.size() < 4 || tmp[tmp.size()-4] != '.')
      {
      newTarget += ".exe";
      }
#endif // WIN32
#endif
  }
  std::string config =
    mf->GetSafeDefinition("CMAKE_TRY_COMPILE_CONFIGURATION");
  return this->Build(srcdir, bindir, projectName, newTarget, output, "",
                     config, false, fast, false, this->TryCompileTimeout);
}